

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O2

xmlChar * xmlDictExists(xmlDictPtr dict,xmlChar *name,int len)

{
  _xmlDictEntry *p_Var1;
  xmlChar *pxVar2;
  _xmlDict *p_Var3;
  ulong uVar4;
  int iVar5;
  uint32_t uVar6;
  size_t sVar7;
  unsigned_long uVar8;
  ulong uVar9;
  ulong __n;
  uint namelen;
  _xmlDictEntry *p_Var10;
  
  if (name != (xmlChar *)0x0 && dict != (xmlDictPtr)0x0) {
    sVar7 = (size_t)(uint)len;
    if (len < 0) {
      sVar7 = strlen((char *)name);
    }
    namelen = (uint)sVar7;
    __n = sVar7 & 0xffffffff;
    if (dict->limit == 0) {
      if (0x3fffffff < namelen) {
        return (xmlChar *)0x0;
      }
    }
    else if (0x3fffffff < namelen || dict->limit <= __n) {
      return (xmlChar *)0x0;
    }
    uVar9 = dict->size;
    if (uVar9 == 0x80) {
      uVar8 = xmlDictComputeFastKey(name,namelen,dict->seed);
    }
    else {
      uVar6 = xmlDictComputeBigKey(name,namelen,dict->seed);
      uVar8 = (unsigned_long)uVar6;
    }
    if (dict->dict[uVar8 % uVar9].valid != 0) {
      p_Var1 = dict->dict + uVar8 % uVar9;
      while( true ) {
        p_Var10 = p_Var1;
        p_Var1 = p_Var10->next;
        if (p_Var1 == (_xmlDictEntry *)0x0) break;
        if ((p_Var10->okey == uVar8) && (p_Var10->len == namelen)) {
          pxVar2 = p_Var10->name;
          iVar5 = bcmp(pxVar2,name,__n);
          if (iVar5 == 0) {
            return pxVar2;
          }
        }
      }
      if ((p_Var10->okey == uVar8) && (p_Var10->len == namelen)) {
        pxVar2 = p_Var10->name;
        iVar5 = bcmp(pxVar2,name,__n);
        if (iVar5 == 0) {
          return pxVar2;
        }
      }
    }
    p_Var3 = dict->subdict;
    if (p_Var3 != (_xmlDict *)0x0) {
      uVar4 = p_Var3->size;
      if (uVar9 == 0x80) {
        uVar9 = 0x80;
        if (uVar4 != 0x80) {
          uVar6 = xmlDictComputeBigKey(name,namelen,p_Var3->seed);
          uVar8 = (unsigned_long)uVar6;
          uVar9 = uVar4;
        }
      }
      else {
        uVar9 = uVar4;
        if (uVar4 == 0x80) {
          uVar8 = xmlDictComputeFastKey(name,namelen,p_Var3->seed);
          uVar9 = 0x80;
        }
      }
      if (p_Var3->dict[uVar8 % uVar9].valid != 0) {
        p_Var1 = p_Var3->dict + uVar8 % uVar9;
        while( true ) {
          p_Var10 = p_Var1;
          p_Var1 = p_Var10->next;
          if (p_Var1 == (_xmlDictEntry *)0x0) break;
          if ((p_Var10->okey == uVar8) && (p_Var10->len == namelen)) {
            pxVar2 = p_Var10->name;
            iVar5 = bcmp(pxVar2,name,__n);
            if (iVar5 == 0) {
              return pxVar2;
            }
          }
        }
        if ((p_Var10->okey == uVar8) && (p_Var10->len == namelen)) {
          pxVar2 = p_Var10->name;
          iVar5 = bcmp(pxVar2,name,__n);
          if (iVar5 == 0) {
            return pxVar2;
          }
        }
      }
    }
  }
  return (xmlChar *)0x0;
}

Assistant:

const xmlChar *
xmlDictExists(xmlDictPtr dict, const xmlChar *name, int len) {
    unsigned long key, okey;
    xmlDictEntryPtr insert;
    unsigned int l;

    if ((dict == NULL) || (name == NULL))
	return(NULL);

    if (len < 0)
        l = strlen((const char *) name);
    else
        l = len;
    if (((dict->limit > 0) && (l >= dict->limit)) ||
        (l > INT_MAX / 2))
        return(NULL);

    /*
     * Check for duplicate and insertion location.
     */
    okey = xmlDictComputeKey(dict, name, l);
    key = okey % dict->size;
    if (dict->dict[key].valid == 0) {
	insert = NULL;
    } else {
	for (insert = &(dict->dict[key]); insert->next != NULL;
	     insert = insert->next) {
#ifdef __GNUC__
	    if ((insert->okey == okey) && (insert->len == l)) {
		if (!memcmp(insert->name, name, l))
		    return(insert->name);
	    }
#else
	    if ((insert->okey == okey) && (insert->len == l) &&
	        (!xmlStrncmp(insert->name, name, l)))
		return(insert->name);
#endif
	}
#ifdef __GNUC__
	if ((insert->okey == okey) && (insert->len == l)) {
	    if (!memcmp(insert->name, name, l))
		return(insert->name);
	}
#else
	if ((insert->okey == okey) && (insert->len == l) &&
	    (!xmlStrncmp(insert->name, name, l)))
	    return(insert->name);
#endif
    }

    if (dict->subdict) {
        unsigned long skey;

        /* we cannot always reuse the same okey for the subdict */
        if (((dict->size == MIN_DICT_SIZE) &&
	     (dict->subdict->size != MIN_DICT_SIZE)) ||
            ((dict->size != MIN_DICT_SIZE) &&
	     (dict->subdict->size == MIN_DICT_SIZE)))
	    skey = xmlDictComputeKey(dict->subdict, name, l);
	else
	    skey = okey;

	key = skey % dict->subdict->size;
	if (dict->subdict->dict[key].valid != 0) {
	    xmlDictEntryPtr tmp;

	    for (tmp = &(dict->subdict->dict[key]); tmp->next != NULL;
		 tmp = tmp->next) {
#ifdef __GNUC__
		if ((tmp->okey == skey) && (tmp->len == l)) {
		    if (!memcmp(tmp->name, name, l))
			return(tmp->name);
		}
#else
		if ((tmp->okey == skey) && (tmp->len == l) &&
		    (!xmlStrncmp(tmp->name, name, l)))
		    return(tmp->name);
#endif
	    }
#ifdef __GNUC__
	    if ((tmp->okey == skey) && (tmp->len == l)) {
		if (!memcmp(tmp->name, name, l))
		    return(tmp->name);
	    }
#else
	    if ((tmp->okey == skey) && (tmp->len == l) &&
		(!xmlStrncmp(tmp->name, name, l)))
		return(tmp->name);
#endif
	}
    }

    /* not found */
    return(NULL);
}